

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O0

void ga_init_nbhandle(Integer *nbhandle)

{
  uint uVar1;
  uint *in_RDI;
  gai_nbhdl_t *oldhdl;
  Integer itmp;
  gai_nbhdl_t *inbhandle;
  int iloc;
  int idx;
  int top;
  int i;
  uint local_14;
  
  lastGAhandle = (lastGAhandle + 1) % nb_max_outstanding;
  uVar1 = lastGAhandle;
  while ((local_14 = lastGAhandle, (int)uVar1 < lastGAhandle + nb_max_outstanding &&
         (local_14 = (int)uVar1 % nb_max_outstanding,
         ga_ihdl_array[(int)local_14].ahandle != (ga_armcihdl_t *)0x0))) {
    uVar1 = uVar1 + 1;
  }
  if (ga_ihdl_array[(int)local_14].ahandle != (ga_armcihdl_t *)0x0) {
    nga_wait_internal((Integer *)CONCAT44(uVar1,lastGAhandle + nb_max_outstanding));
  }
  *in_RDI = *in_RDI & 0xffffff00 | local_14 & 0xff;
  uVar1 = get_next_tag();
  *in_RDI = *in_RDI & 0xff | uVar1 << 8;
  ga_ihdl_array[(int)local_14].ahandle = (ga_armcihdl_t *)0x0;
  ga_ihdl_array[(int)local_14].count = 0;
  ga_ihdl_array[(int)local_14].active = 1;
  ga_ihdl_array[(int)local_14].ga_nbtag = *in_RDI >> 8;
  lastGAhandle = local_14;
  return;
}

Assistant:

void ga_init_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  lastGAhandle++;
  lastGAhandle = lastGAhandle%nb_max_outstanding;
  top = lastGAhandle+nb_max_outstanding;
  /* default index if no handles are available */
  idx = lastGAhandle;
  for (i=lastGAhandle; i<top; i++) {
    iloc = i%nb_max_outstanding;
    if (ga_ihdl_array[iloc].ahandle == NULL) {
      idx = iloc;
      break;
    }
  }
  /* If no free handle is found, clear the oldest handle */
  if (ga_ihdl_array[idx].ahandle != NULL) {
    Integer itmp;
    /* find value of itmp corresponding to oldest handle */
    gai_nbhdl_t *oldhdl = (gai_nbhdl_t*)&itmp;
    oldhdl->ihdl_index = idx;
    oldhdl->ga_nbtag = ga_ihdl_array[idx].ga_nbtag;
    nga_wait_internal(&itmp);
  }
  inbhandle->ihdl_index = idx;
  inbhandle->ga_nbtag = get_next_tag();
  ga_ihdl_array[idx].ahandle = NULL;
  ga_ihdl_array[idx].count = 0;
  ga_ihdl_array[idx].active = 1;
  ga_ihdl_array[idx].ga_nbtag = inbhandle->ga_nbtag;

  /* reset lastGAhandle to idx */
  lastGAhandle = idx;
  return;
}